

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

uint prvTidyHTMLVersionNumberFromCode(uint vers)

{
  uint local_14;
  uint i;
  uint vers_local;
  
  local_14 = 0;
  while( true ) {
    if (W3C_Doctypes[local_14].name == (ctmbstr)0x0) {
      return 0;
    }
    if (W3C_Doctypes[local_14].vers == vers) break;
    local_14 = local_14 + 1;
  }
  return W3C_Doctypes[local_14].vers_out;
}

Assistant:

uint TY_(HTMLVersionNumberFromCode)( uint vers )
{
    uint i;

    for (i = 0; W3C_Doctypes[i].name; ++i)
        if (W3C_Doctypes[i].vers == vers)
            return W3C_Doctypes[i].vers_out;

    return VERS_UNKNOWN;
}